

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O2

void __thiscall Potassco::SmodelsOutput::external(SmodelsOutput *this,Atom_t a,Value_t t)

{
  if (this->ext_ != false) {
    if (t.val_ == Release) {
      startRule(this,0x5c);
    }
    else {
      startRule(this,0x5b);
      add(this,a);
      a = (t.val_ ^ Release) - True;
    }
    add(this,a);
    endRule(this);
    return;
  }
  fail(-2,"virtual void Potassco::SmodelsOutput::external(Atom_t, Value_t)",0x15b,"ext_",
       "external directive not supported in smodels format",0);
}

Assistant:

void SmodelsOutput::external(Atom_t a, Value_t t) {
	POTASSCO_REQUIRE(ext_, "external directive not supported in smodels format");
	if (t != Value_t::Release) {
		startRule(ClaspAssignExt).add(a).add((unsigned(t)^3)-1).endRule();
	}
	else {
		startRule(ClaspReleaseExt).add(a).endRule();
	}
}